

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stock.cpp
# Opt level: O2

void __thiscall L10_2::Stock::buy(Stock *this,long num,double price)

{
  long lVar1;
  
  if (-1 < num) {
    lVar1 = num + this->shares;
    this->shares = lVar1;
    this->share_val = price;
    this->total_val = (double)lVar1 * price;
    return;
  }
  std::operator<<((ostream *)&std::cout,
                  "Number of shares purchased can\'t be negative. Transaction is aborted.\n");
}

Assistant:

void L10_2::Stock::buy(long num, double price) {
    if (num < 0) {
        std::cout << "Number of shares purchased can't be negative. Transaction is aborted.\n";
    } else {
        shares += num;
        share_val = price;
        set_tot();
    }
}